

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Vec_Int_t *
Acb_NtkCollectCopies(Acb_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR,Vec_Bit_t **pvPolar)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void **__s;
  void *__s_00;
  Vec_Bit_t *pVVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  char *local_60;
  
  uVar15 = (p->vTargets).nSize;
  __ptr = Acb_NtkFindNodes2(p);
  iVar3 = (p->vObjType).nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar3 - 2U) {
    iVar14 = iVar3 + -1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar14;
  if (iVar14 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar14 << 2);
  }
  p_00->pArray = piVar5;
  uVar16 = pGia->nObjs;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar16 - 1) {
    uVar13 = uVar16;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar13;
  if (uVar13 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar13 << 3);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = uVar16;
  memset(__s,0,(long)(int)uVar16 << 3);
  iVar3 = (((int)uVar16 >> 5) + 1) - (uint)((uVar16 & 0x1f) == 0);
  iVar14 = iVar3 * 0x20;
  if (iVar3 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)iVar3 * 4);
  }
  sVar9 = (long)iVar3 * 4;
  piVar5 = (int *)0x0;
  memset(__s_00,0,sVar9);
  pVVar7 = (Vec_Bit_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar14;
  if (iVar3 != 0) {
    piVar5 = (int *)malloc(sVar9);
  }
  pVVar7->pArray = piVar5;
  pVVar7->nSize = iVar14;
  memset(piVar5,0,sVar9);
  pVVar12 = pGia->vCis;
  uVar11 = (ulong)(uint)pVVar12->nSize;
  if (0 < pVVar12->nSize) {
    lVar18 = 0;
    do {
      iVar3 = pVVar12->pArray[lVar18];
      if (((long)iVar3 < 0) || (pGia->nObjs <= iVar3)) goto LAB_003aee8c;
      if (iVar3 == 0) break;
      if (lVar18 < (int)((int)uVar11 - uVar15)) {
        if ((p->vCis).nSize <= lVar18) goto LAB_003aee6d;
        iVar4 = (p->vCis).pArray[lVar18];
      }
      else {
        uVar11 = (ulong)(uint)-(int)uVar11 + (ulong)uVar15 + lVar18;
        iVar4 = (int)uVar11;
        if ((iVar4 < 0) || ((p->vTargets).nSize <= iVar4)) goto LAB_003aee6d;
        iVar4 = (p->vTargets).pArray[uVar11 & 0xffffffff];
      }
      if ((long)iVar4 < 1) goto LAB_003aef11;
      iVar2 = (p->vObjName).nSize;
      if (iVar2 < 1) goto LAB_003aeeca;
      if (iVar2 <= iVar4) goto LAB_003aee6d;
      pcVar8 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar4]);
      if (pcVar8 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        sVar9 = strlen(pcVar8);
        pcVar10 = (char *)malloc(sVar9 + 1);
        strcpy(pcVar10,pcVar8);
      }
      if (pVVar6->nSize <= iVar3) goto LAB_003aeeab;
      pVVar6->pArray[iVar3] = pcVar10;
      lVar18 = lVar18 + 1;
      pVVar12 = pGia->vCis;
      uVar11 = (ulong)pVVar12->nSize;
    } while (lVar18 < (long)uVar11);
  }
  pVVar12 = pGia->vCos;
  if (0 < pVVar12->nSize) {
    lVar18 = 0;
    do {
      iVar3 = pVVar12->pArray[lVar18];
      lVar17 = (long)iVar3;
      if ((lVar17 < 0) || (pGia->nObjs <= iVar3)) goto LAB_003aee8c;
      if (iVar3 == 0) break;
      uVar15 = iVar3 - (*(uint *)(pGia->pObjs + lVar17) & 0x1fffffff);
      if (((int)uVar15 < 0) || (iVar14 <= (int)uVar15)) goto LAB_003aef30;
      puVar1 = (uint *)((long)__s_00 + (ulong)(uVar15 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar15 & 0x1f);
      if ((p->vCos).nSize <= lVar18) goto LAB_003aee6d;
      iVar4 = (p->vCos).pArray[lVar18];
      if ((long)iVar4 < 1) {
LAB_003aef11:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      iVar2 = (p->vObjName).nSize;
      if (iVar2 < 1) goto LAB_003aeeca;
      if (iVar2 <= iVar4) goto LAB_003aee6d;
      pcVar8 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar4]);
      if (pcVar8 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        sVar9 = strlen(pcVar8);
        pcVar10 = (char *)malloc(sVar9 + 1);
        strcpy(pcVar10,pcVar8);
      }
      if (pVVar6->nSize <= iVar3) goto LAB_003aeeab;
      pVVar6->pArray[lVar17] = pcVar10;
      Vec_IntPush(p_00,iVar3);
      lVar18 = lVar18 + 1;
      pVVar12 = pGia->vCos;
    } while (lVar18 < pVVar12->nSize);
  }
  iVar3 = __ptr->nSize;
  if (0 < (long)iVar3) {
    piVar5 = __ptr->pArray;
    lVar18 = 0;
    do {
      iVar4 = piVar5[lVar18];
      lVar17 = (long)iVar4;
      if (lVar17 < 1) {
        pcVar8 = "i>0";
LAB_003aeef9:
        __assert_fail(pcVar8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
      }
      iVar2 = (p->vObjCopy).nSize;
      if (iVar2 < 1) {
        pcVar8 = "Acb_NtkHasObjCopies(p)";
        goto LAB_003aeef9;
      }
      if (iVar2 <= iVar4) goto LAB_003aee6d;
      uVar15 = (p->vObjCopy).pArray[lVar17];
      if (-1 < (int)uVar15) {
        uVar16 = uVar15 >> 1;
        if (pGia->nObjs <= (int)uVar16) {
LAB_003aee8c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGia->pObjs + uVar16) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGia->pObjs + uVar16)) {
          if (iVar14 <= (int)uVar16) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          uVar11 = (ulong)(uVar15 >> 6);
          if ((*(uint *)((long)__s_00 + uVar11 * 4) >> (uVar16 & 0x1f) & 1) == 0) {
            if (pVVar6->nSize <= (int)uVar16) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (pVVar6->pArray[uVar16] == (void *)0x0) {
              iVar2 = (p->vObjName).nSize;
              if (iVar2 < 1) {
LAB_003aeeca:
                __assert_fail("Acb_NtkHasObjNames(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                              ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
              }
              if (iVar2 <= iVar4) {
LAB_003aee6d:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pcVar8 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[lVar17]);
              if (pcVar8 == (char *)0x0) {
                local_60 = (char *)0x0;
              }
              else {
                sVar9 = strlen(pcVar8);
                local_60 = (char *)malloc(sVar9 + 1);
                strcpy(local_60,pcVar8);
              }
              if (pVVar6->nSize <= (int)uVar16) {
LAB_003aeeab:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
              }
              pVVar6->pArray[uVar16] = local_60;
              Vec_IntPush(p_00,uVar16);
              if (pVVar7->nSize <= (int)uVar16) {
LAB_003aef30:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                              ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
              }
              uVar16 = 1 << (sbyte)(uVar16 & 0x1f);
              if ((uVar15 & 1) == 0) {
                pVVar7->pArray[uVar11] = pVVar7->pArray[uVar11] & ~uVar16;
              }
              else {
                pVVar7->pArray[uVar11] = pVVar7->pArray[uVar11] | uVar16;
              }
            }
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while (iVar3 != lVar18);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
  *pvNodesR = pVVar6;
  *pvPolar = pVVar7;
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectCopies( Acb_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR, Vec_Bit_t ** pvPolar )
{
    int i, iObj, iLit, nTargets = Vec_IntSize(&p->vTargets);
    Vec_Int_t * vObjs   = Acb_NtkFindNodes2( p );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Acb_NtkObjNum(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vDriver = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vPolar  = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCiId( pGia, iObj, i )
        if ( i < Gia_ManCiNum(pGia) - nTargets )
            Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Acb_NtkCi(p, i))) );
        else
            Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Vec_IntEntry(&p->vTargets, i-(Gia_ManCiNum(pGia) - nTargets)))) );
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        Vec_BitWriteEntry( vDriver, Gia_ObjFaninId0(Gia_ManObj(pGia, iObj), iObj), 1 );
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Acb_NtkCo(p, i))) );
        Vec_IntPush( vNodes, iObj );
    }
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( (iLit = Acb_ObjCopy(p, iObj)) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( !Vec_BitEntry(vDriver, Abc_Lit2Var(iLit)) && Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
                Vec_BitWriteEntry( vPolar, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
            }
        }
    Vec_BitFree( vDriver );
    Vec_IntFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    *pvPolar  = vPolar;
    return vNodes;
}